

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
ParserValidationErrorTest_ResolvedUndefinedOptionError_Test::TestBody
          (ParserValidationErrorTest_ResolvedUndefinedOptionError_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  Descriptor *this_00;
  FileDescriptor *pFVar3;
  char *pcVar4;
  uint32_t *puVar5;
  Arena *pAVar6;
  string *value;
  DescriptorProto *this_01;
  FieldDescriptorProto *this_02;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  this_03;
  char *in_R9;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390;
  string_view local_378;
  string local_368;
  AssertHelper local_348;
  Message local_340;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__1;
  FieldDescriptorProto *extension;
  FieldDescriptorProto *field;
  DescriptorProto *message;
  FileDescriptorProto other_file;
  string local_208;
  AssertHelper local_1e8;
  Message local_1e0;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_1b0 [8];
  FileDescriptorProto descriptor_proto;
  ParserValidationErrorTest_ResolvedUndefinedOptionError_Test *this_local;
  
  descriptor_proto.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_1b0);
  this_00 = DescriptorProto::descriptor();
  pFVar3 = Descriptor::file(this_00);
  FileDescriptor::CopyTo(pFVar3,(FileDescriptorProto *)local_1b0);
  pFVar3 = DescriptorPool::BuildFile
                     (&(this->super_ParserValidationErrorTest).pool_,
                      (FileDescriptorProto *)local_1b0);
  local_1d1 = pFVar3 != (FileDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar2) {
    testing::Message::Message(&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_208,(internal *)local_1d0,
               (AssertionResult *)"pool_.BuildFile(descriptor_proto) != nullptr","false","true",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xa29,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    testing::Message::~Message(&local_1e0);
  }
  other_file.field_0._229_3_ = 0;
  other_file.field_0._228_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  if (other_file.field_0._228_4_ == 0) {
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&message);
    puVar5 = protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)
                        &other_file.super_Message.super_MessageLite._internal_metadata_,0);
    *(byte *)puVar5 = (byte)*puVar5 | 1;
    pAVar6 = protobuf::MessageLite::GetArena((MessageLite *)&message);
    protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)
               &other_file.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,
               "base2.proto",pAVar6);
    puVar5 = protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)
                        &other_file.super_Message.super_MessageLite._internal_metadata_,0);
    *(byte *)puVar5 = (byte)*puVar5 | 2;
    pAVar6 = protobuf::MessageLite::GetArena((MessageLite *)&message);
    protobuf::internal::ArenaStringPtr::Set(&other_file.field_0._impl_.name_,"baz",pAVar6);
    FileDescriptorProto::add_dependency_abi_cxx11_((FileDescriptorProto *)&message);
    value = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)local_1b0);
    FileDescriptorProto::set_dependency<std::__cxx11::string_const&>
              ((FileDescriptorProto *)&message,0,value);
    this_01 = FileDescriptorProto::add_message_type((FileDescriptorProto *)&message);
    puVar5 = protobuf::internal::HasBits<1>::operator[](&(this_01->field_0)._impl_._has_bits_,0);
    *(byte *)puVar5 = (byte)*puVar5 | 1;
    pAVar6 = protobuf::MessageLite::GetArena((MessageLite *)this_01);
    protobuf::internal::ArenaStringPtr::Set(&(this_01->field_0)._impl_.name_,"Bar",pAVar6);
    this_02 = DescriptorProto::add_field(this_01);
    puVar5 = protobuf::internal::HasBits<1>::operator[](&(this_02->field_0)._impl_._has_bits_,0);
    *(byte *)puVar5 = (byte)*puVar5 | 1;
    pAVar6 = protobuf::MessageLite::GetArena((MessageLite *)this_02);
    protobuf::internal::ArenaStringPtr::Set(&(this_02->field_0)._impl_.name_,"foo",pAVar6);
    FieldDescriptorProto::set_number(this_02,1);
    FieldDescriptorProto::set_label(this_02,FieldDescriptorProto_Label_LABEL_OPTIONAL);
    FieldDescriptorProto::set_type(this_02,FieldDescriptorProto_Type_TYPE_INT32);
    this_03.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )FileDescriptorProto::add_extension((FileDescriptorProto *)&message);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )this_03.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    puVar5 = protobuf::internal::HasBits<1>::operator[]
                       (&(((anon_union_80_1_493b367e_for_FieldDescriptorProto_32 *)
                          ((long)this_03.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 0x10))->_impl_)._has_bits_,0);
    *(byte *)puVar5 = (byte)*puVar5 | 1;
    pAVar6 = protobuf::MessageLite::GetArena
                       ((MessageLite *)
                        this_03.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
    protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)
               ((long)this_03.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x18),"bar",pAVar6);
    FieldDescriptorProto::set_number
              ((FieldDescriptorProto *)
               gtest_ar__1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,0x7513b5);
    FieldDescriptorProto::set_label
              ((FieldDescriptorProto *)
               gtest_ar__1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,FieldDescriptorProto_Label_LABEL_OPTIONAL);
    FieldDescriptorProto::set_type
              ((FieldDescriptorProto *)
               gtest_ar__1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,FieldDescriptorProto_Type_TYPE_MESSAGE);
    uVar1 = gtest_ar__1.message_;
    puVar5 = protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)
                        ((long)gtest_ar__1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + 0x10),0);
    *(byte *)puVar5 = (byte)*puVar5 | 4;
    pAVar6 = protobuf::MessageLite::GetArena
                       ((MessageLite *)
                        uVar1._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
    protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)
               ((long)uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x28),"Bar",pAVar6);
    uVar1 = gtest_ar__1.message_;
    puVar5 = protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)
                        ((long)gtest_ar__1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + 0x10),0);
    *(byte *)puVar5 = (byte)*puVar5 | 2;
    pAVar6 = protobuf::MessageLite::GetArena
                       ((MessageLite *)
                        uVar1._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
    protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)
               ((long)uVar1._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x20),"google.protobuf.FileOptions",pAVar6);
    pFVar3 = DescriptorPool::BuildFile
                       (&(this->super_ParserValidationErrorTest).pool_,
                        (FileDescriptorProto *)&message);
    local_331 = pFVar3 != (FileDescriptor *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_330,&local_331,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
    if (!bVar2) {
      testing::Message::Message(&local_340);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_368,(internal *)local_330,
                 (AssertionResult *)"pool_.BuildFile(other_file) != nullptr","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_348,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                 ,0xa46,pcVar4);
      testing::internal::AssertHelper::operator=(&local_348,&local_340);
      testing::internal::AssertHelper::~AssertHelper(&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      testing::Message::~Message(&local_340);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_378,"package qux.baz;\nimport \"base2.proto\";\noption (baz.bar).foo = 1;\n");
    testing::
    Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Matcher(&local_390,
            "2:7: Option \"(baz.bar)\" is resolved to \"(qux.baz.bar)\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"(.baz.bar)\") to start from the outermost scope.\n"
           );
    ParserTest::ExpectHasValidationErrors
              (&this->super_ParserValidationErrorTest,local_378,&local_390);
    testing::
    Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Matcher(&local_390);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&message);
    other_file.field_0._228_4_ = 0;
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1b0);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, ResolvedUndefinedOptionError) {
  // Build descriptor message in test pool
  FileDescriptorProto descriptor_proto;
  DescriptorProto::descriptor()->file()->CopyTo(&descriptor_proto);
  ASSERT_TRUE(pool_.BuildFile(descriptor_proto) != nullptr);

  // base2.proto:
  //   package baz
  //   import google/protobuf/descriptor.proto
  //   message Bar { optional int32 foo = 1; }
  //   extend FileOptions { optional Bar bar = 7672757; }
  FileDescriptorProto other_file;
  other_file.set_name("base2.proto");
  other_file.set_package("baz");
  other_file.add_dependency();
  other_file.set_dependency(0, descriptor_proto.name());

  DescriptorProto* message(other_file.add_message_type());
  message->set_name("Bar");
  FieldDescriptorProto* field(message->add_field());
  field->set_name("foo");
  field->set_number(1);
  field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  field->set_type(FieldDescriptorProto::TYPE_INT32);

  FieldDescriptorProto* extension(other_file.add_extension());
  extension->set_name("bar");
  extension->set_number(7672757);
  extension->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  extension->set_type(FieldDescriptorProto::TYPE_MESSAGE);
  extension->set_type_name("Bar");
  extension->set_extendee("google.protobuf.FileOptions");

  EXPECT_TRUE(pool_.BuildFile(other_file) != nullptr);

  // qux.proto:
  //   package qux.baz
  //   option (baz.bar).foo = 1;
  //
  // Although "baz.bar" is already defined, the lookup code will try
  // "qux.baz.bar", since it's the match from the innermost scope,
  // which will cause a symbol not defined error.
  ExpectHasValidationErrors(
      "package qux.baz;\n"
      "import \"base2.proto\";\n"
      "option (baz.bar).foo = 1;\n",
      "2:7: Option \"(baz.bar)\" is resolved to \"(qux.baz.bar)\","
      " which is not defined. The innermost scope is searched first "
      "in name resolution. Consider using a leading '.'(i.e., \"(.baz.bar)\")"
      " to start from the outermost scope.\n");
}